

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

void configure_char_sheet(void)

{
  int iVar1;
  ui_entry_iterator *puVar2;
  ui_entry **ppuVar3;
  ui_entry *puVar4;
  char_sheet_resist *pcVar5;
  ui_entry *entry;
  wchar_t j;
  wchar_t next_col;
  wchar_t n;
  wchar_t i;
  ui_entry_iterator *ui_iter;
  char *test_categories [2];
  char *region_categories [4];
  
  test_categories[1] = "resistances";
  release_char_sheet_config();
  cached_config = (char_sheet_config *)mem_alloc(0x88);
  ui_iter = (ui_entry_iterator *)anon_var_dwarf_131562;
  test_categories[0] = "stat_modifiers";
  puVar2 = initialize_ui_entry_iterator(check_for_two_categories,&ui_iter,"stat_modifiers");
  j = count_ui_entry_iterator(puVar2);
  if (L'\x05' < j) {
    j = L'\x05';
  }
  cached_config->n_stat_mod_entries = j;
  ppuVar3 = (ui_entry **)mem_alloc((long)j << 3);
  cached_config->stat_mod_entries = ppuVar3;
  for (next_col = L'\0'; next_col < j; next_col = next_col + L'\x01') {
    puVar4 = advance_ui_entry_iterator(puVar2);
    cached_config->stat_mod_entries[next_col] = puVar4;
  }
  release_ui_entry_iterator(puVar2);
  cached_config->res_nlabel = L'\x06';
  cached_config->res_cols = cached_config->res_nlabel + L'\x01' + (uint)(player->body).count;
  cached_config->res_rows = L'\0';
  entry._4_4_ = 0;
  for (next_col = L'\0'; next_col < L'\x04'; next_col = next_col + L'\x01') {
    cached_config->res_regions[next_col].col = entry._4_4_;
    cached_config->res_regions[next_col].row = 7;
    iVar1 = 0;
    if (next_col % 2 == 0) {
      iVar1 = 5;
    }
    cached_config->res_regions[next_col].width = cached_config->res_cols + iVar1;
    entry._4_4_ = cached_config->res_regions[next_col].width + 1 + entry._4_4_;
    test_categories[0] = test_categories[(long)next_col + 1];
    puVar2 = initialize_ui_entry_iterator
                       (check_for_two_categories,&ui_iter,test_categories[(long)next_col + 1]);
    j = count_ui_entry_iterator(puVar2);
    if (0x16 < j + L'\x02' + cached_config->res_regions[next_col].row) {
      j = L'\x14' - cached_config->res_regions[next_col].row;
    }
    cached_config->n_resist_by_region[next_col] = j;
    pcVar5 = (char_sheet_resist *)mem_alloc((long)j << 5);
    cached_config->resists_by_region[next_col] = pcVar5;
    for (entry._0_4_ = L'\0'; (wchar_t)entry < j; entry._0_4_ = (wchar_t)entry + L'\x01') {
      puVar4 = advance_ui_entry_iterator(puVar2);
      cached_config->resists_by_region[next_col][(wchar_t)entry].entry = puVar4;
      get_ui_entry_label(puVar4,cached_config->res_nlabel,true,
                         cached_config->resists_by_region[next_col][(wchar_t)entry].label);
      text_mbstowcs(cached_config->resists_by_region[next_col][(wchar_t)entry].label + 5,":",L'\x01'
                   );
    }
    release_ui_entry_iterator(puVar2);
    if (cached_config->res_rows < cached_config->n_resist_by_region[next_col]) {
      cached_config->res_rows = cached_config->n_resist_by_region[next_col];
    }
  }
  for (next_col = L'\0'; next_col < L'\x04'; next_col = next_col + L'\x01') {
    cached_config->res_regions[next_col].page_rows = cached_config->res_rows + L'\x02';
  }
  return;
}

Assistant:

static void configure_char_sheet(void)
{
	const char* region_categories[] = {
		"resistances",
		"abilities",
		"modifiers",
		"hindrances"
	};
	const char* test_categories[2];
	struct ui_entry_iterator* ui_iter;
	int i, n, next_col;

	release_char_sheet_config();

	cached_config = mem_alloc(sizeof(*cached_config));

	test_categories[0] = "CHAR_SCREEN1";
	test_categories[1] = "stat_modifiers";
	ui_iter = initialize_ui_entry_iterator(check_for_two_categories,
		test_categories, test_categories[1]);
	n = count_ui_entry_iterator(ui_iter);
	/*
	 * Linked to hardcoded stats display with STAT_MAX entries so only use
	 * that many.
	 */
	if (n > STAT_MAX) {
	    n = STAT_MAX;
	}
	cached_config->n_stat_mod_entries = n;
	cached_config->stat_mod_entries = mem_alloc(n *
		sizeof(*cached_config->stat_mod_entries));
	for (i = 0; i < n; ++i) {
		cached_config->stat_mod_entries[i] =
			advance_ui_entry_iterator(ui_iter);
	}
	release_ui_entry_iterator(ui_iter);

	cached_config->res_nlabel = 6;
	cached_config->res_cols =
		cached_config->res_nlabel + 1 + player->body.count;
	cached_config->res_rows = 0;
	next_col = 0;
	for (i = 0; i < 4; ++i) {
		int j;

		//cached_config->res_regions[i].col =
		//	i * (cached_config->res_cols + 1);
		cached_config->res_regions[i].col = next_col;
		cached_config->res_regions[i].row = 2 + STAT_MAX;
		cached_config->res_regions[i].width = cached_config->res_cols
			+ ((i % 2 == 0) ? 5 : 0);
		next_col += cached_config->res_regions[i].width + 1;

		test_categories[1] = region_categories[i];
		ui_iter = initialize_ui_entry_iterator(check_for_two_categories, test_categories, region_categories[i]);
		n = count_ui_entry_iterator(ui_iter);
		/*
		 * Fit in 24 row display; leave at least one row blank before
		 * prompt on last row.
		 */
		if (n + 2 + cached_config->res_regions[i].row > 22) {
		    n = 20 - cached_config->res_regions[i].row;
		}
		cached_config->n_resist_by_region[i] = n;
		cached_config->resists_by_region[i] = mem_alloc(n * sizeof(*cached_config->resists_by_region[i]));
		for (j = 0; j < n; ++j) {
			struct ui_entry *entry = advance_ui_entry_iterator(ui_iter);

			cached_config->resists_by_region[i][j].entry = entry;
			get_ui_entry_label(entry, cached_config->res_nlabel, true, cached_config->resists_by_region[i][j].label);
			(void) text_mbstowcs(cached_config->resists_by_region[i][j].label + 5, ":", 1);
		}
		release_ui_entry_iterator(ui_iter);

		if (cached_config->res_rows <
			cached_config->n_resist_by_region[i]) {
			cached_config->res_rows =
				cached_config->n_resist_by_region[i];
		}
	}
	for (i = 0; i < 4; ++i) {
		cached_config->res_regions[i].page_rows =
			cached_config->res_rows + 2;
	}
}